

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O1

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::OccludingGeometryComplexityCostCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,OccludingGeometryComplexityCostCase *this)

{
  uint uVar1;
  deUint32 dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int x;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int x_1;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  Random rng;
  float local_224;
  vector<float,_std::allocator<float>_> local_208;
  ulong local_1e8;
  float local_1e0;
  float local_1dc;
  undefined1 local_1d8 [16];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_1c0;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  undefined4 local_19c;
  float local_198;
  float local_194;
  float local_190;
  undefined4 local_18c;
  float local_188;
  float local_184;
  float local_180;
  undefined4 local_17c;
  float local_178;
  float local_174;
  float local_170;
  undefined4 local_16c;
  float local_168;
  float local_164;
  float local_160;
  undefined4 local_15c;
  float local_158;
  float local_154;
  float local_150;
  undefined4 local_14c;
  undefined1 local_148 [16];
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  float local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  deRandom local_110;
  ProgramSources local_100;
  
  Utils::getBaseShader();
  uVar1 = this->m_resolution;
  uVar6 = (ulong)uVar1;
  dVar2 = deStringHash((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  uVar3 = tcu::CommandLine::getBaseSeed
                    (((this->super_RenderCountCase).super_BaseCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_cmdLine);
  local_1d8 = ZEXT416((uint)this->m_xyNoise);
  local_148 = ZEXT416((uint)this->m_zNoise);
  uVar9 = uVar1 + 1;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&local_1c0,(long)(int)(uVar9 * uVar9),(allocator_type *)&local_1a8);
  uVar11 = (dVar2 >> 0x10 ^ dVar2 ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_110,uVar11 >> 0xf ^ uVar3 ^ uVar11);
  local_1e8 = (ulong)uVar9;
  if (uVar1 < 0x7fffffff) {
    local_138 = -(float)local_1d8._0_4_;
    uStack_134 = local_1d8._4_4_ ^ 0x80000000;
    uStack_130 = local_1d8._8_4_ ^ 0x80000000;
    uStack_12c = local_1d8._12_4_ ^ 0x80000000;
    local_1d8._0_4_ = (float)local_1d8._0_4_ + (float)local_1d8._0_4_;
    local_128 = -(float)local_148._0_4_;
    uStack_124 = local_148._4_4_ ^ 0x80000000;
    uStack_120 = local_148._8_4_ ^ 0x80000000;
    uStack_11c = local_148._12_4_ ^ 0x80000000;
    local_148._0_4_ = (float)local_148._0_4_ + (float)local_148._0_4_;
    lVar13 = 0;
    uVar11 = 0;
    do {
      fVar15 = (float)(int)uVar11 / (float)(int)uVar1;
      local_1e0 = fVar15 + fVar15 + -1.0;
      uVar10 = 0;
      do {
        fVar15 = (float)(int)uVar10 / (float)(int)uVar1;
        local_1dc = fVar15 + fVar15 + -1.0;
        fVar15 = 0.0;
        local_224 = 0.0;
        if ((uVar6 != uVar10 && uVar11 != uVar1) && (uVar10 != 0 && uVar11 != 0)) {
          fVar15 = deRandom_getFloat(&local_110);
          local_224 = fVar15 * (float)local_1d8._0_4_ + local_138;
          fVar15 = deRandom_getFloat(&local_110);
          fVar15 = fVar15 * (float)local_1d8._0_4_ + local_138;
        }
        fVar16 = deRandom_getFloat(&local_110);
        iVar4 = (int)lVar13 + (int)uVar10;
        local_1c0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0] = local_1dc + local_224;
        local_1c0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1] = fVar15 + local_1e0;
        local_1c0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2] =
             fVar16 * (float)local_148._0_4_ + local_128 + 0.2;
        uVar10 = uVar10 + 1;
      } while (local_1e8 != uVar10);
      lVar13 = lVar13 + local_1e8;
      bVar14 = uVar11 != uVar1;
      uVar11 = uVar11 + 1;
    } while (bVar14);
  }
  std::vector<float,_std::allocator<float>_>::reserve(&local_208,(long)(int)(uVar1 * uVar1 * 6));
  if (0 < (int)uVar1) {
    lVar13 = 0;
    uVar11 = 0;
    uVar10 = uVar6;
    do {
      uVar11 = uVar11 + 1;
      uVar12 = 0;
      do {
        iVar4 = (int)uVar12;
        iVar5 = (int)lVar13 + iVar4;
        iVar7 = (int)lVar13 + iVar4 + 1;
        iVar8 = (int)uVar10 + 1 + iVar4;
        iVar4 = (int)uVar10 + 2 + iVar4;
        local_1a8 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[0];
        local_1a4 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[1];
        local_1a0 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar5].m_data[2];
        local_19c = 0;
        local_198 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
        local_194 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
        local_190 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
        local_18c = 0x3f800000;
        local_188 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[0];
        local_184 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[1];
        local_180 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[2];
        local_17c = 0x40000000;
        local_178 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0];
        local_174 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1];
        local_170 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2];
        local_16c = 0;
        local_168 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[0];
        local_164 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[1];
        local_160 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar7].m_data[2];
        local_15c = 0x3f800000;
        local_158 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[0];
        local_154 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[1];
        local_150 = local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar8].m_data[2];
        local_14c = 0x40000000;
        std::vector<float,std::allocator<float>>::_M_range_insert<float_const*>
                  ((vector<float,std::allocator<float>> *)&local_208,
                   local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1a8,local_148);
        uVar12 = uVar12 + 1;
      } while (uVar6 != uVar12);
      uVar10 = uVar10 + local_1e8;
      lVar13 = lVar13 + local_1e8;
    } while (uVar11 != uVar1);
  }
  if (local_1c0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ObjectData::ObjectData(__return_storage_ptr__,&local_100,&local_208);
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar13 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar13));
    lVar13 = lVar13 + -0x18;
  } while (lVar13 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry						(void) const
	{
		return ObjectData(Utils::getBaseShader(),
						  Utils::getFullScreenGrid(m_resolution,
						  deInt32Hash(deStringHash(getName())) ^ m_testCtx.getCommandLine().getBaseSeed(),
						  0.2f,
						  m_zNoise,
						  m_xyNoise));
	}